

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmDependsFortran.cxx
# Opt level: O2

bool __thiscall
cmDependsFortran::Finalize(cmDependsFortran *this,ostream *makeDepends,ostream *internalDepends)

{
  string *psVar1;
  _Rb_tree_header *p_Var2;
  char *stamp_dir;
  cmMakefile *this_00;
  cmDependsFortranInternals *pcVar3;
  char *pcVar4;
  _Base_ptr p_Var5;
  ostream *poVar6;
  _Rb_tree_node_base *p_Var7;
  string mod_dir;
  string currentBinDir;
  string fiName;
  string fcName;
  string mod_lower;
  string mod_upper;
  string stamp;
  cmGeneratedFileStream fcStream;
  cmGeneratedFileStream fiStream;
  string local_5c0;
  string local_5a0;
  char *local_580 [4];
  char *local_560 [4];
  string local_540;
  string local_520;
  string local_500;
  string local_4e0;
  cmGeneratedFileStream local_4c0;
  cmGeneratedFileStream local_278;
  
  LocateModules(this);
  stamp_dir = (this->super_cmDepends).TargetDirectory._M_dataplus._M_p;
  this_00 = ((this->super_cmDepends).LocalGenerator)->Makefile;
  std::__cxx11::string::string
            ((string *)&local_278,"CMAKE_Fortran_TARGET_MODULE_DIR",(allocator *)&local_4c0);
  pcVar4 = cmMakefile::GetSafeDefinition(this_00,(string *)&local_278);
  std::__cxx11::string::string((string *)&local_5c0,pcVar4,(allocator *)local_580);
  std::__cxx11::string::~string((string *)&local_278);
  if (local_5c0._M_string_length == 0) {
    cmLocalGenerator::GetCurrentBinaryDirectory((this->super_cmDepends).LocalGenerator);
    std::__cxx11::string::assign((char *)&local_5c0);
  }
  psVar1 = &(this->super_cmDepends).TargetDirectory;
  pcVar3 = this->Internal;
  for (p_Var5 = (pcVar3->ObjectInfo)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != &(pcVar3->ObjectInfo)._M_t._M_impl.super__Rb_tree_header;
      p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    WriteDependenciesReal
              (this,*(char **)(p_Var5 + 1),(cmFortranSourceInfo *)(p_Var5 + 2),&local_5c0,stamp_dir,
               makeDepends,internalDepends);
  }
  std::__cxx11::string::string((string *)local_580,(string *)psVar1);
  std::__cxx11::string::append((char *)local_580);
  cmGeneratedFileStream::cmGeneratedFileStream(&local_278,local_580[0],false,None);
  std::operator<<((ostream *)&local_278,"# The fortran modules provided by this target.\n");
  std::operator<<((ostream *)&local_278,"provides\n");
  pcVar3 = this->Internal;
  p_Var2 = &(pcVar3->TargetProvides)._M_t._M_impl.super__Rb_tree_header;
  for (p_Var5 = (pcVar3->TargetProvides)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var5 != p_Var2; p_Var5 = (_Base_ptr)std::_Rb_tree_increment(p_Var5)) {
    poVar6 = std::operator<<((ostream *)&local_278," ");
    poVar6 = std::operator<<(poVar6,(string *)(p_Var5 + 1));
    std::operator<<(poVar6,"\n");
  }
  if ((pcVar3->TargetProvides)._M_t._M_impl.super__Rb_tree_header._M_node_count != 0) {
    std::__cxx11::string::string((string *)local_560,(string *)psVar1);
    std::__cxx11::string::append((char *)local_560);
    cmGeneratedFileStream::cmGeneratedFileStream(&local_4c0,local_560[0],false,None);
    std::operator<<((ostream *)&local_4c0,"# Remove fortran modules provided by this target.\n");
    std::operator<<((ostream *)&local_4c0,"FILE(REMOVE");
    pcVar4 = cmLocalGenerator::GetCurrentBinaryDirectory((this->super_cmDepends).LocalGenerator);
    std::__cxx11::string::string((string *)&local_5a0,pcVar4,(allocator *)&local_500);
    for (p_Var7 = (pcVar3->TargetProvides)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var7 != p_Var2;
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7)) {
      std::__cxx11::string::string((string *)&local_500,(string *)&local_5c0);
      std::__cxx11::string::append((char *)&local_500);
      cmsys::SystemTools::UpperCase(&local_520,(string *)(p_Var7 + 1));
      std::__cxx11::string::append((string *)&local_500);
      std::__cxx11::string::~string((string *)&local_520);
      std::__cxx11::string::append((char *)&local_500);
      std::__cxx11::string::string((string *)&local_520,(string *)&local_5c0);
      std::__cxx11::string::append((char *)&local_520);
      std::__cxx11::string::append((string *)&local_520);
      std::__cxx11::string::append((char *)&local_520);
      std::__cxx11::string::string((string *)&local_4e0,stamp_dir,(allocator *)&local_540);
      std::__cxx11::string::append((char *)&local_4e0);
      std::__cxx11::string::append((string *)&local_4e0);
      std::__cxx11::string::append((char *)&local_4e0);
      std::operator<<((ostream *)&local_4c0,"\n");
      poVar6 = std::operator<<((ostream *)&local_4c0,"  \"");
      MaybeConvertToRelativePath(&local_540,this,&local_5a0,&local_520);
      poVar6 = std::operator<<(poVar6,(string *)&local_540);
      std::operator<<(poVar6,"\"\n");
      std::__cxx11::string::~string((string *)&local_540);
      poVar6 = std::operator<<((ostream *)&local_4c0,"  \"");
      MaybeConvertToRelativePath(&local_540,this,&local_5a0,&local_500);
      poVar6 = std::operator<<(poVar6,(string *)&local_540);
      std::operator<<(poVar6,"\"\n");
      std::__cxx11::string::~string((string *)&local_540);
      poVar6 = std::operator<<((ostream *)&local_4c0,"  \"");
      MaybeConvertToRelativePath(&local_540,this,&local_5a0,&local_4e0);
      poVar6 = std::operator<<(poVar6,(string *)&local_540);
      std::operator<<(poVar6,"\"\n");
      std::__cxx11::string::~string((string *)&local_540);
      std::__cxx11::string::~string((string *)&local_4e0);
      std::__cxx11::string::~string((string *)&local_520);
      std::__cxx11::string::~string((string *)&local_500);
    }
    std::operator<<((ostream *)&local_4c0,"  )\n");
    std::__cxx11::string::~string((string *)&local_5a0);
    cmGeneratedFileStream::~cmGeneratedFileStream(&local_4c0);
    std::__cxx11::string::~string((string *)local_560);
  }
  cmGeneratedFileStream::~cmGeneratedFileStream(&local_278);
  std::__cxx11::string::~string((string *)local_580);
  std::__cxx11::string::~string((string *)&local_5c0);
  return true;
}

Assistant:

bool cmDependsFortran::Finalize(std::ostream& makeDepends,
                                std::ostream& internalDepends)
{
  // Prepare the module search process.
  this->LocateModules();

  // Get the directory in which stamp files will be stored.
  const char* stamp_dir = this->TargetDirectory.c_str();

  // Get the directory in which module files will be created.
  cmMakefile* mf = this->LocalGenerator->GetMakefile();
  std::string mod_dir =
    mf->GetSafeDefinition("CMAKE_Fortran_TARGET_MODULE_DIR");
  if (mod_dir.empty()) {
    mod_dir = this->LocalGenerator->GetCurrentBinaryDirectory();
  }

  // Actually write dependencies to the streams.
  typedef cmDependsFortranInternals::ObjectInfoMap ObjectInfoMap;
  ObjectInfoMap const& objInfo = this->Internal->ObjectInfo;
  for (ObjectInfoMap::const_iterator i = objInfo.begin(); i != objInfo.end();
       ++i) {
    if (!this->WriteDependenciesReal(i->first.c_str(), i->second, mod_dir,
                                     stamp_dir, makeDepends,
                                     internalDepends)) {
      return false;
    }
  }

  // Store the list of modules provided by this target.
  std::string fiName = this->TargetDirectory;
  fiName += "/fortran.internal";
  cmGeneratedFileStream fiStream(fiName.c_str());
  fiStream << "# The fortran modules provided by this target.\n";
  fiStream << "provides\n";
  std::set<std::string> const& provides = this->Internal->TargetProvides;
  for (std::set<std::string>::const_iterator i = provides.begin();
       i != provides.end(); ++i) {
    fiStream << " " << *i << "\n";
  }

  // Create a script to clean the modules.
  if (!provides.empty()) {
    std::string fcName = this->TargetDirectory;
    fcName += "/cmake_clean_Fortran.cmake";
    cmGeneratedFileStream fcStream(fcName.c_str());
    fcStream << "# Remove fortran modules provided by this target.\n";
    fcStream << "FILE(REMOVE";
    std::string currentBinDir =
      this->LocalGenerator->GetCurrentBinaryDirectory();
    for (std::set<std::string>::const_iterator i = provides.begin();
         i != provides.end(); ++i) {
      std::string mod_upper = mod_dir;
      mod_upper += "/";
      mod_upper += cmSystemTools::UpperCase(*i);
      mod_upper += ".mod";
      std::string mod_lower = mod_dir;
      mod_lower += "/";
      mod_lower += *i;
      mod_lower += ".mod";
      std::string stamp = stamp_dir;
      stamp += "/";
      stamp += *i;
      stamp += ".mod.stamp";
      fcStream << "\n";
      fcStream << "  \""
               << this->MaybeConvertToRelativePath(currentBinDir, mod_lower)
               << "\"\n";
      fcStream << "  \""
               << this->MaybeConvertToRelativePath(currentBinDir, mod_upper)
               << "\"\n";
      fcStream << "  \""
               << this->MaybeConvertToRelativePath(currentBinDir, stamp)
               << "\"\n";
    }
    fcStream << "  )\n";
  }
  return true;
}